

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

ServerSegment * __thiscall ServerService::parseRequest(ServerService *this,byte *buffer)

{
  byte ackFlag;
  byte finFlag;
  byte2 checksum;
  byte2 reserved;
  byte4 seqNumber;
  byte4 ackNumber;
  ServerSegment *this_00;
  
  seqNumber = *(byte4 *)buffer;
  ackNumber = *(byte4 *)(buffer + 4);
  ackFlag = buffer[8];
  finFlag = buffer[9];
  checksum = *(byte2 *)(buffer + 0xc);
  reserved = *(byte2 *)(buffer + 0xe);
  this_00 = (ServerSegment *)operator_new(0x18);
  ServerSegment::ServerSegment
            (this_00,seqNumber,finFlag,buffer + 0x10,ackNumber,ackFlag,checksum,reserved);
  return this_00;
}

Assistant:

ServerSegment *ServerService::parseRequest(byte *buffer) {
    byte4 seqNo = (buffer[3] << 24) | (buffer[2] << 16) | (buffer[1] << 8) | (buffer[0]);
    byte4 ackNo = (buffer[7] << 24) | (buffer[6] << 16) | (buffer[5] << 8) | (buffer[4]);
    byte ackFlag = (byte) buffer[8];
    byte finFlag = (byte) buffer[9];
    byte2 length = (buffer[11] << 8) | (buffer[10]);
    byte2 checksum = (buffer[13] << 8) | (buffer[12]);
    byte2 reserved = (buffer[15] << 8) | (buffer[14]);
    byte *data = &buffer[16];
    return new ServerSegment(seqNo, finFlag, data, ackNo, ackFlag, checksum, reserved);
}